

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::CompressedRunContainerScanState::LoadNextRun(CompressedRunContainerScanState *this)

{
  byte bVar1;
  idx_t iVar2;
  uint16_t uVar3;
  ushort uVar4;
  int in_ESI;
  
  if ((this->super_RunContainerScanState).run_index < (this->super_RunContainerScanState).count) {
    uVar3 = ContainerSegmentScan::operator++(&this->segment,in_ESI);
    uVar4 = (this->super_RunContainerScanState).data
            [(this->super_RunContainerScanState).run_index * 2] + uVar3;
    uVar3 = ContainerSegmentScan::operator++(&this->segment,in_ESI);
    iVar2 = (this->super_RunContainerScanState).run_index;
    bVar1 = (this->super_RunContainerScanState).data[iVar2 * 2 + 1];
    (this->super_RunContainerScanState).run.start = uVar4;
    (this->super_RunContainerScanState).run.length = ~uVar4 + bVar1 + uVar3;
    (this->super_RunContainerScanState).run_index = iVar2 + 1;
  }
  else {
    (this->super_RunContainerScanState).finished = true;
  }
  return;
}

Assistant:

void CompressedRunContainerScanState::LoadNextRun() {
	if (run_index >= count) {
		finished = true;
		return;
	}
	uint16_t start = segment++;
	start += reinterpret_cast<uint8_t *>(data)[(run_index * 2) + 0];

	uint16_t end = segment++;
	end += reinterpret_cast<uint8_t *>(data)[(run_index * 2) + 1];

	D_ASSERT(end > start);
	run = RunContainerRLEPair {start, static_cast<uint16_t>(end - 1 - start)};
	run_index++;
}